

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

void __thiscall re2c::Scanner::fatalf_at(Scanner *this,uint32_t line,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_10f8 [24];
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined4 local_1048;
  undefined4 local_1044;
  va_list args;
  char local_1028 [8];
  char szBuf [4096];
  char *fmt_local;
  uint32_t line_local;
  Scanner *this_local;
  
  if (in_AL != '\0') {
    local_10c8 = in_XMM0_Qa;
    local_10b8 = in_XMM1_Qa;
    local_10a8 = in_XMM2_Qa;
    local_1098 = in_XMM3_Qa;
    local_1088 = in_XMM4_Qa;
    local_1078 = in_XMM5_Qa;
    local_1068 = in_XMM6_Qa;
    local_1058 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_10f8;
  args[0]._0_8_ = &stack0x00000008;
  local_1044 = 0x30;
  local_1048 = 0x18;
  local_10e0 = in_RCX;
  local_10d8 = in_R8;
  local_10d0 = in_R9;
  vsnprintf(local_1028,0x1000,fmt,&local_1048);
  szBuf[0xff7] = '0';
  fatal_at(this,line,0,local_1028);
  return;
}

Assistant:

void Scanner::fatalf_at(uint32_t line, const char* fmt, ...) const
{
	char szBuf[4096];

	va_list args;
	
	va_start(args, fmt);
	vsnprintf(szBuf, sizeof(szBuf), fmt, args);
	va_end(args);
	
	szBuf[sizeof(szBuf)-1] = '0';
	
	fatal_at(line, 0, szBuf);
}